

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotator.cpp
# Opt level: O0

void __thiscall libcellml::Annotator::setModel(Annotator *this,ModelPtr *model)

{
  AnnotatorImpl *pAVar1;
  ModelPtr *model_local;
  Annotator *this_local;
  
  pAVar1 = pFunc(this);
  std::weak_ptr<libcellml::Model>::operator=(&pAVar1->mModel,model);
  pAVar1 = pFunc(this);
  pAVar1->mHash = 0;
  pAVar1 = pFunc(this);
  AnnotatorImpl::update(pAVar1);
  return;
}

Assistant:

void Annotator::setModel(const ModelPtr &model)
{
    pFunc()->mModel = model;
    pFunc()->mHash = 0;
    pFunc()->update();
}